

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMimeGlobPattern>::copyAppend
          (QGenericArrayOps<QMimeGlobPattern> *this,QMimeGlobPattern *b,QMimeGlobPattern *e)

{
  QMimeGlobPattern *pQVar1;
  Data *pDVar2;
  CaseSensitivity CVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMimeGlobPattern>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size;
    do {
      pDVar2 = (b->m_pattern).d.d;
      pQVar1[lVar4].m_pattern.d.d = pDVar2;
      pQVar1[lVar4].m_pattern.d.ptr = (b->m_pattern).d.ptr;
      pQVar1[lVar4].m_pattern.d.size = (b->m_pattern).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar2 = (b->m_mimeType).d.d;
      pQVar1[lVar4].m_mimeType.d.d = pDVar2;
      pQVar1[lVar4].m_mimeType.d.ptr = (b->m_mimeType).d.ptr;
      pQVar1[lVar4].m_mimeType.d.size = (b->m_mimeType).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar1[lVar4].m_patternType = b->m_patternType;
      CVar3 = b->m_caseSensitivity;
      pQVar1[lVar4].m_weight = b->m_weight;
      pQVar1[lVar4].m_caseSensitivity = CVar3;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size + 1;
      (this->super_QArrayDataPointer<QMimeGlobPattern>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }